

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

network_target *
new_network_target(stumpless_network_protocol network,stumpless_transport_protocol transport)

{
  network_target *target_00;
  char *mem;
  network_target *pnVar1;
  network_target *init_result;
  char *port_copy;
  network_target *target;
  stumpless_transport_protocol transport_local;
  stumpless_network_protocol network_local;
  
  target_00 = (network_target *)alloc_mem(0x50);
  if (target_00 != (network_target *)0x0) {
    mem = copy_cstring("514");
    if (mem != (char *)0x0) {
      target_00->destination = (char *)0x0;
      target_00->port = mem;
      target_00->max_msg_size = 0x5c0;
      target_00->network = network;
      target_00->transport = transport;
      pnVar1 = init_network_target(target_00);
      if (pnVar1 != (network_target *)0x0) {
        return target_00;
      }
      free_mem(mem);
    }
    free_mem(target_00);
  }
  return (network_target *)0x0;
}

Assistant:

struct network_target *
new_network_target( enum stumpless_network_protocol network,
                    enum stumpless_transport_protocol transport ) {
  struct network_target *target;
  const char *port_copy;
  const struct network_target *init_result;

  target = alloc_mem( sizeof( *target ) );
  if( !target ) {
    goto fail;
  }

  port_copy = copy_cstring( STUMPLESS_DEFAULT_TRANSPORT_PORT );
  if( !port_copy ) {
    goto fail_port;
  }

  target->destination = NULL;
  target->port = port_copy;
  target->max_msg_size = STUMPLESS_DEFAULT_UDP_MAX_MESSAGE_SIZE;
  target->network = network;
  target->transport = transport;

  init_result = init_network_target( target );
  if( !init_result ) {
    goto fail_init;
  }

  return target;

fail_init:
  free_mem( port_copy );
fail_port:
  free_mem( target );
fail:
  return NULL;
}